

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall DecisionNode::chooseOptimalField(DecisionNode *this)

{
  int4 iVar1;
  int4 iVar2;
  double dVar3;
  int local_3c;
  int4 maxfixed;
  int4 numfixed;
  int4 maxlength;
  double sc;
  int local_20;
  int iStack_1c;
  bool context;
  int4 size;
  int4 sbit;
  double score;
  DecisionNode *this_local;
  
  _size = 0.0;
  local_3c = 1;
  sc._7_1_ = true;
  do {
    iVar1 = getMaximumLength(this,sc._7_1_);
    for (iStack_1c = 0; iStack_1c < iVar1 << 3; iStack_1c = iStack_1c + 1) {
      iVar2 = getNumFixed(this,iStack_1c,1,sc._7_1_);
      if (local_3c <= iVar2) {
        dVar3 = getScore(this,iStack_1c,1,sc._7_1_);
        if ((iVar2 <= local_3c) || (dVar3 <= 0.0)) {
          if (_size < dVar3) {
            this->startbit = iStack_1c;
            this->bitsize = 1;
            this->contextdecision = sc._7_1_;
            _size = dVar3;
          }
        }
        else {
          this->startbit = iStack_1c;
          this->bitsize = 1;
          this->contextdecision = sc._7_1_;
          local_3c = iVar2;
          _size = dVar3;
        }
      }
    }
    sc._7_1_ = (bool)((sc._7_1_ ^ 0xffU) & 1);
  } while (((sc._7_1_ ^ 0xffU) & 1) != 0);
  sc._7_1_ = true;
  do {
    iVar1 = getMaximumLength(this,sc._7_1_);
    for (local_20 = 2; local_20 < 9; local_20 = local_20 + 1) {
      for (iStack_1c = 0; iStack_1c < (iVar1 * 8 - local_20) + 1; iStack_1c = iStack_1c + 1) {
        iVar2 = getNumFixed(this,iStack_1c,local_20,sc._7_1_);
        if ((local_3c <= iVar2) &&
           (dVar3 = getScore(this,iStack_1c,local_20,sc._7_1_), _size < dVar3)) {
          this->startbit = iStack_1c;
          this->bitsize = local_20;
          this->contextdecision = sc._7_1_;
          _size = dVar3;
        }
      }
    }
    sc._7_1_ = (bool)((sc._7_1_ ^ 0xffU) & 1);
  } while (((sc._7_1_ ^ 0xffU) & 1) != 0);
  if (_size <= 0.0) {
    this->bitsize = 0;
  }
  return;
}

Assistant:

void DecisionNode::chooseOptimalField(void)

{
  double score = 0.0;
  
  int4 sbit,size;		// The current field
  bool context;
  double sc;

  int4 maxlength,numfixed,maxfixed;

  maxfixed = 1;
  context = true;
  do {
    maxlength = 8*getMaximumLength(context);
    for(sbit=0;sbit<maxlength;++sbit) {
      numfixed = getNumFixed(sbit,1,context); // How may patterns specify this bit
      if (numfixed < maxfixed) continue; // Skip this bit, if we don't have maximum specification
      sc = getScore(sbit,1,context);

 // if we got more patterns this time than previously, and a positive score, reset
 // the high score (we prefer this bit, because it has a higher numfixed, regardless
 // of the difference in score, as long as the new score is positive).
      if ((numfixed > maxfixed)&&(sc > 0.0)) {
	score = sc;
	maxfixed = numfixed;
	startbit = sbit;
	bitsize = 1;
	contextdecision = context;
	continue;
      }
				// We have maximum patterns
      if (sc > score) {
	score = sc;
	startbit = sbit;
	bitsize = 1;
	contextdecision = context;
      }
    }
    context = !context;
  } while(!context);

  context = true;
  do {
    maxlength = 8*getMaximumLength(context);
    for(size=2;size <= 8;++size) {
      for(sbit=0;sbit<maxlength-size+1;++sbit) {
	if (getNumFixed(sbit,size,context) < maxfixed) continue; // Consider only maximal fields
	sc = getScore(sbit,size,context);
	if (sc > score) {
	  score = sc;
	  startbit = sbit;
	  bitsize = size;
	  contextdecision = context;
	}
      }
    }
    context = !context;
  } while(!context);
  if (score <= 0.0)		// If we failed to get a positive score
    bitsize = 0;		// treat the node as terminal
}